

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X3DImporter.cpp
# Opt level: O2

void __thiscall
Assimp::X3DImporter::MeshGeometry_AddTexCoord
          (X3DImporter *this,aiMesh *pMesh,
          list<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_> *pTexCoords)

{
  uint uVar1;
  size_type __n;
  aiVector3D *paVar2;
  long lVar3;
  DeadlyImportError *this_00;
  size_t i;
  ulong uVar4;
  _List_node_base *p_Var5;
  ulong uVar6;
  allocator<char> local_69;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> tc_arr_copy;
  undefined1 local_50 [32];
  
  tc_arr_copy.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  tc_arr_copy.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  tc_arr_copy.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  __n = (pTexCoords->super__List_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>).
        _M_impl._M_node._M_size;
  if (__n == pMesh->mNumVertices) {
    std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::reserve(&tc_arr_copy,__n);
    p_Var5 = (_List_node_base *)pTexCoords;
    while (p_Var5 = (((_List_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_> *)
                     &p_Var5->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
          p_Var5 != (_List_node_base *)pTexCoords) {
      local_50._0_8_ = p_Var5[1]._M_next;
      local_50._8_4_ = 0.0;
      std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
      emplace_back<aiVector3t<float>>
                ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)&tc_arr_copy,
                 (aiVector3t<float> *)local_50);
    }
    uVar1 = pMesh->mNumVertices;
    uVar4 = (ulong)uVar1;
    paVar2 = (aiVector3D *)operator_new__(uVar4 * 0xc);
    if (uVar1 != 0) {
      uVar6 = uVar4 * 0xc - 0xc;
      memset(paVar2,0,(uVar6 - uVar6 % 0xc) + 0xc);
    }
    pMesh->mTextureCoords[0] = paVar2;
    pMesh->mNumUVComponents[0] = 2;
    lVar3 = 0;
    for (uVar6 = 0; uVar6 < uVar4; uVar6 = uVar6 + 1) {
      paVar2 = pMesh->mTextureCoords[0];
      *(undefined4 *)((long)&paVar2->z + lVar3) =
           *(undefined4 *)
            ((long)&(tc_arr_copy.
                     super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                     _M_impl.super__Vector_impl_data._M_start)->z + lVar3);
      *(undefined8 *)((long)&paVar2->x + lVar3) =
           *(undefined8 *)
            ((long)&(tc_arr_copy.
                     super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                     _M_impl.super__Vector_impl_data._M_start)->x + lVar3);
      uVar4 = (ulong)pMesh->mNumVertices;
      lVar3 = lVar3 + 0xc;
    }
    std::_Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::~_Vector_base
              (&tc_arr_copy.
                super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>);
    return;
  }
  this_00 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_50,
             "MeshGeometry_AddTexCoord. Texture coordinates and vertices count must be equal.",
             &local_69);
  DeadlyImportError::DeadlyImportError(this_00,(string *)local_50);
  __cxa_throw(this_00,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void X3DImporter::MeshGeometry_AddTexCoord(aiMesh& pMesh, const std::list<aiVector2D>& pTexCoords) const
{
    std::vector<aiVector3D> tc_arr_copy;

    if ( pTexCoords.size() != pMesh.mNumVertices )
    {
        throw DeadlyImportError( "MeshGeometry_AddTexCoord. Texture coordinates and vertices count must be equal." );
    }

	// copy list to array because we are need convert aiVector2D to aiVector3D and also get indexed access as a bonus.
	tc_arr_copy.reserve(pTexCoords.size());
    for ( std::list<aiVector2D>::const_iterator it = pTexCoords.begin(); it != pTexCoords.end(); ++it )
    {
        tc_arr_copy.push_back( aiVector3D( ( *it ).x, ( *it ).y, 0 ) );
    }

	// copy texture coordinates to mesh
	pMesh.mTextureCoords[0] = new aiVector3D[pMesh.mNumVertices];
	pMesh.mNumUVComponents[0] = 2;
    for ( size_t i = 0; i < pMesh.mNumVertices; i++ )
    {
        pMesh.mTextureCoords[ 0 ][ i ] = tc_arr_copy[ i ];
    }
}